

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O0

BIGNUM * asn1_string_to_bn(ASN1_STRING *ai,BIGNUM *bn,int type)

{
  BIGNUM *ret;
  int type_local;
  BIGNUM *bn_local;
  ASN1_STRING *ai_local;
  
  if ((ai->type & 0xfffffeffU) == type) {
    ai_local = (ASN1_STRING *)BN_bin2bn(ai->data,ai->length,(BIGNUM *)bn);
    if ((BIGNUM *)ai_local == (BIGNUM *)0x0) {
      ERR_put_error(0xc,0,0x69,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                    ,0x1aa);
    }
    else if ((ai->type & 0x100U) != 0) {
      BN_set_negative((BIGNUM *)ai_local,1);
    }
  }
  else {
    ERR_put_error(0xc,0,0xc3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_int.cc"
                  ,0x1a4);
    ai_local = (ASN1_STRING *)0x0;
  }
  return (BIGNUM *)ai_local;
}

Assistant:

static BIGNUM *asn1_string_to_bn(const ASN1_STRING *ai, BIGNUM *bn, int type) {
  if ((ai->type & ~V_ASN1_NEG) != type) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_INTEGER_TYPE);
    return NULL;
  }

  BIGNUM *ret;
  if ((ret = BN_bin2bn(ai->data, ai->length, bn)) == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_BN_LIB);
  } else if (ai->type & V_ASN1_NEG) {
    BN_set_negative(ret, 1);
  }
  return ret;
}